

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jemalloc_internal_inlines_b.h
# Opt level: O3

arena_t * arena_choose(tsd_t *tsd,arena_t *arena)

{
  uint uVar1;
  arena_t *paVar2;
  uint uVar3;
  arena_t *local_30;
  
  if (arena == (arena_t *)0x0) {
    if (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_reentrancy_level < '\x01') {
      arena = tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_arena;
      if (arena == (arena_t *)0x0) {
        arena_choose_cold_1();
        arena = local_30;
      }
      if (percpu_arena_disabled < opt_percpu_arena) {
        uVar1 = (ncpus >> 1) + (ncpus & 1);
        if (ncpus < 2) {
          uVar1 = ncpus;
        }
        if (opt_percpu_arena != per_phycpu_arena) {
          uVar1 = ncpus;
        }
        if ((arena->base->ind < uVar1) && (&arena->last_thd->tsd != tsd)) {
          uVar1 = sched_getcpu();
          if (opt_percpu_arena != percpu_arena) {
            uVar3 = 0;
            if (ncpus >> 1 <= uVar1) {
              uVar3 = ncpus >> 1;
            }
            uVar1 = uVar1 - uVar3;
          }
          if (arena->base->ind != uVar1) {
            uVar3 = tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_arena->base->ind;
            if (uVar3 != uVar1) {
              paVar2 = (arena_t *)arenas[uVar1].repr;
              if (paVar2 == (arena_t *)0x0) {
                paVar2 = arena_init((tsdn_t *)tsd,uVar1,&extent_hooks_default);
              }
              arena_migrate(tsd,uVar3,uVar1);
              if (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled == true)
              {
                tcache_arena_reassociate
                          ((tsdn_t *)tsd,
                           &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache,paVar2
                          );
              }
            }
            arena = tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_arena;
          }
          arena->last_thd = (tsdn_t *)tsd;
        }
      }
    }
    else {
      arena = (arena_t *)arenas[0].repr;
      if (arenas[0].repr == (void *)0x0) {
        paVar2 = arena_init((tsdn_t *)tsd,0,&extent_hooks_default);
        return paVar2;
      }
    }
  }
  return arena;
}

Assistant:

static inline arena_t *
arena_choose(tsd_t *tsd, arena_t *arena) {
	return arena_choose_impl(tsd, arena, false);
}